

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tree_schema_free.c
# Opt level: O0

void lysp_type_enum_free(lysf_ctx *ctx,lysp_type_enum *item)

{
  lysp_ext_instance *local_48;
  ulong local_38;
  lysp_ext_instance *local_28;
  uint64_t c___1;
  uint64_t c__;
  lysp_type_enum *item_local;
  lysf_ctx *ctx_local;
  
  lydict_remove(ctx->ctx,item->name);
  lydict_remove(ctx->ctx,item->dsc);
  lydict_remove(ctx->ctx,item->ref);
  c___1 = 0;
  while( true ) {
    if (item->iffeatures == (lysp_qname *)0x0) {
      local_38 = 0;
    }
    else {
      local_38 = *(ulong *)&item->iffeatures[-1].flags;
    }
    if (local_38 <= c___1) break;
    lysp_qname_free(ctx->ctx,item->iffeatures + c___1);
    c___1 = c___1 + 1;
  }
  if (item->iffeatures != (lysp_qname *)0x0) {
    free(&item->iffeatures[-1].flags);
  }
  local_28 = (lysp_ext_instance *)0x0;
  while( true ) {
    if (item->exts == (lysp_ext_instance *)0x0) {
      local_48 = (lysp_ext_instance *)0x0;
    }
    else {
      local_48 = item->exts[-1].exts;
    }
    if (local_48 <= local_28) break;
    lysp_ext_instance_free(ctx,item->exts + (long)local_28);
    local_28 = (lysp_ext_instance *)((long)&local_28->name + 1);
  }
  if (item->exts != (lysp_ext_instance *)0x0) {
    free(&item->exts[-1].exts);
  }
  return;
}

Assistant:

static void
lysp_type_enum_free(struct lysf_ctx *ctx, struct lysp_type_enum *item)
{
    lydict_remove(ctx->ctx, item->name);
    lydict_remove(ctx->ctx, item->dsc);
    lydict_remove(ctx->ctx, item->ref);
    FREE_ARRAY(ctx->ctx, item->iffeatures, lysp_qname_free);
    FREE_ARRAY(ctx, item->exts, lysp_ext_instance_free);
}